

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O0

void __thiscall binpac::FlowBuffer::ResetLineState(FlowBuffer *this)

{
  FlowBuffer *this_local;
  
  if (this->linebreak_style_ == CR_OR_LF) {
    this->state_ = CR_OR_LF_0;
  }
  else if (this->linebreak_style_ == STRICT_CRLF) {
    this->state_ = FRAME_MODE;
  }
  return;
}

Assistant:

void FlowBuffer::ResetLineState()
	{
	switch ( linebreak_style_ )
		{
		case CR_OR_LF:
			state_ = CR_OR_LF_0;
			break;
		case STRICT_CRLF:
			state_ = STRICT_CRLF_0;
			break;
		case LINE_BREAKER:
			break; // Nothing to reset
		default:
			BINPAC_ASSERT(0);
			break;
		}
	}